

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::coordinateBindingTest<false>(ViewTest *this)

{
  undefined1 *puVar1;
  allocator<int> *paVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  size_t sVar6;
  reference piVar7;
  bool local_e51;
  bool local_e19;
  bool local_de1;
  bool local_da9;
  bool local_d71;
  bool local_d39;
  bool local_d01;
  bool local_cc9;
  bool local_c91;
  bool local_c59;
  bool local_c29;
  bool local_bf1;
  bool local_ba9;
  bool local_b99;
  bool local_b51;
  bool local_b41;
  bool local_b09;
  bool local_ad5;
  int local_ad4;
  int local_ad0;
  int x_7;
  int y_5;
  int z;
  int i_4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_ab8;
  undefined1 local_ab0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_14;
  undefined1 local_a68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_14;
  int local_a48;
  int local_a44;
  int x_6;
  int y_4;
  int i_3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a30;
  undefined1 local_a28 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_13;
  undefined1 local_9e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_13;
  int local_9c0;
  bool local_9ba;
  allocator<int> local_9b9;
  int i_2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_9b0;
  undefined1 local_9a8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_12;
  undefined1 local_960 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_12;
  undefined1 local_930 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_8e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  int local_8c8;
  bool local_8c2;
  allocator<int> local_8c1;
  int i_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8b8;
  undefined1 local_8b0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_868 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  undefined1 local_838 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_7f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  int local_7d0;
  int local_7cc;
  int x_5;
  int y_3;
  int index_3;
  View<int,_false,_std::allocator<unsigned_long>_> w_8;
  undefined1 local_768 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_720 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  int list_4 [6];
  bool local_6e1;
  int local_6e0;
  int local_6dc;
  int x_4;
  int y_2;
  int index_2;
  View<int,_false,_std::allocator<unsigned_long>_> w_7;
  undefined1 local_678 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_630 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  int list_3 [6];
  bool local_5f1;
  int local_5f0;
  int local_5ec;
  int x_3;
  int y_1;
  int index_1;
  View<int,_false,_std::allocator<unsigned_long>_> w_6;
  undefined1 local_588 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_540 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  int list_2 [8];
  int local_500;
  int local_4fc;
  int x_2;
  int y;
  int index;
  View<int,_false,_std::allocator<unsigned_long>_> w_5;
  undefined1 local_498 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_450 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  int list_1 [8];
  bool local_409;
  int local_408;
  bool local_401;
  int x_1;
  View<int,_false,_std::allocator<unsigned_long>_> w_4;
  undefined1 local_3a8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_360 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  int list [6];
  bool local_325;
  int local_324;
  int local_320;
  int x;
  int i;
  View<int,_false,_std::allocator<unsigned_long>_> w_3;
  undefined1 local_2c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_278 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  undefined1 local_258 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w_2;
  undefined1 local_200 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_1b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  undefined1 local_198 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w_1;
  undefined1 local_140 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  undefined1 local_d8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar1 = &w.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_80,0,7);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  local_b09 = false;
  if (sVar6 == 0) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
    local_b09 = sVar6 == 1;
  }
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_b09;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_d8,0);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = *piVar7 == 7;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar1 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  puVar1 = &w_1.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_140,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_1.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0,3);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
  local_b41 = false;
  if (sVar6 == 1) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
    local_b41 = sVar6 == 4;
  }
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_b41;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_198,0);
  local_b51 = false;
  if (*piVar7 == 3) {
    piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_198,1);
    local_b51 = false;
    if (*piVar7 == 9) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_198,2);
      local_b51 = false;
      if (*piVar7 == 0xf) {
        piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_198,3);
        local_b51 = *piVar7 == 0x15;
      }
    }
  }
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_b51;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  puVar1 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8);
  w_2.geometry_.isSimple_ = false;
  w_2.geometry_._53_3_ = 0;
  paVar2 = (allocator<int> *)((long)&w_2.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_200,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w_2.geometry_.isSimple_,
             &andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w_2.geometry_.coordinateOrder_ + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_258,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_200,0,3);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_258);
  local_b99 = false;
  if (sVar6 == 1) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_258);
    local_b99 = sVar6 == 4;
  }
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_b99;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_258,0);
  local_ba9 = false;
  if (*piVar7 == 0xc) {
    piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_258,1);
    local_ba9 = false;
    if (*piVar7 == 0xd) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_258,2);
      local_ba9 = false;
      if (*piVar7 == 0xe) {
        piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_258,3);
        local_ba9 = *piVar7 == 0xf;
      }
    }
  }
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_ba9;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_258);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_200);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8);
  puVar1 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278);
  puVar1 = &w_3.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_3.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&i,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_2c0,1,2);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
  local_bf1 = false;
  if (sVar6 == 1) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
    local_bf1 = sVar6 == 6;
  }
  x._3_1_ = local_bf1;
  test((bool *)((long)&x + 3));
  local_320 = 0xc;
  for (local_324 = 0; local_324 < 6; local_324 = local_324 + 1) {
    piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&i,local_324);
    local_325 = *piVar7 == this->data_[local_320];
    test(&local_325);
    local_320 = local_320 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278);
  shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x600000002;
  puVar1 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360);
  w_4.geometry_.isSimple_ = false;
  w_4.geometry_._53_3_ = 0;
  paVar2 = (allocator<int> *)((long)&w_4.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_3a8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w_4.geometry_.isSimple_,
             &andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w_4.geometry_.coordinateOrder_ + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_3a8,1,2);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
  local_c29 = false;
  if (sVar6 == 1) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
    local_c29 = sVar6 == 6;
  }
  local_401 = local_c29;
  test(&local_401);
  for (local_408 = 0; local_408 < 6; local_408 = local_408 + 1) {
    piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_1,local_408);
    local_409 = *piVar7 == list[(long)local_408 + -2];
    test(&local_409);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_3a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360);
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x500000002;
  puVar1 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450);
  puVar1 = &w_5.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_498,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_5.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_498,0,2);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&index);
  local_c59 = false;
  if (sVar6 == 8) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&index);
    local_c59 = sVar6 == 2;
  }
  y._3_1_ = local_c59;
  test((bool *)((long)&y + 3));
  x_2 = 0;
  for (local_4fc = 0; local_4fc < 2; local_4fc = local_4fc + 1) {
    for (local_500 = 0; local_500 < 4; local_500 = local_500 + 1) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&index,(long)local_500,
                          local_4fc);
      list_2[7]._3_1_ = *piVar7 == list_1[(long)x_2 + -2];
      test((bool *)((long)list_2 + 0x1f));
      x_2 = x_2 + 1;
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_498);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_450);
  list_2[2] = 0x11;
  list_2[3] = 0x13;
  list_2[4] = 0x15;
  list_2[5] = 0x17;
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1200000010;
  list_2[0] = 0x14;
  list_2[1] = 0x16;
  puVar1 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
  w_6.geometry_.isSimple_ = false;
  w_6.geometry_._53_3_ = 0;
  paVar2 = (allocator<int> *)((long)&w_6.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_588,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w_6.geometry_.isSimple_,
             &andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w_6.geometry_.coordinateOrder_ + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_1,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_588,0,2);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_1);
  local_c91 = false;
  if (sVar6 == 8) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_1);
    local_c91 = sVar6 == 2;
  }
  y_1._3_1_ = local_c91;
  test((bool *)((long)&y_1 + 3));
  x_3 = 0;
  for (local_5ec = 0; local_5ec < 2; local_5ec = local_5ec + 1) {
    for (local_5f0 = 0; local_5f0 < 4; local_5f0 = local_5f0 + 1) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&index_1,(long)local_5f0,
                          local_5ec);
      local_5f1 = *piVar7 == list_2[(long)x_3 + -2];
      test(&local_5f1);
      x_3 = x_3 + 1;
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
  shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x700000006;
  puVar1 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  puVar1 = &w_7.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_678,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_7.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_2,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_678,1,2);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_2);
  local_cc9 = false;
  if (sVar6 == 6) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_2);
    local_cc9 = sVar6 == 2;
  }
  y_2._3_1_ = local_cc9;
  test((bool *)((long)&y_2 + 3));
  x_4 = 0;
  for (local_6dc = 0; local_6dc < 2; local_6dc = local_6dc + 1) {
    for (local_6e0 = 0; local_6e0 < 3; local_6e0 = local_6e0 + 1) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&index_2,(long)local_6e0,
                          local_6dc);
      local_6e1 = *piVar7 == list_3[(long)x_4 + -2];
      test(&local_6e1);
      x_4 = x_4 + 1;
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_678);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xc00000004;
  puVar1 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720);
  w_8.geometry_.isSimple_ = false;
  w_8.geometry_._53_3_ = 0;
  paVar2 = (allocator<int> *)((long)&w_8.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_768,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w_8.geometry_.isSimple_,
             &andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w_8.geometry_.coordinateOrder_ + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_3,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_768,1,2);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_3);
  local_d01 = false;
  if (sVar6 == 6) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_3);
    local_d01 = sVar6 == 2;
  }
  y_3._3_1_ = local_d01;
  test((bool *)((long)&y_3 + 3));
  x_5 = 0;
  for (local_7cc = 0; local_7cc < 2; local_7cc = local_7cc + 1) {
    for (local_7d0 = 0; local_7d0 < 3; local_7d0 = local_7d0 + 1) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&index_3,(long)local_7d0,
                          local_7cc);
      shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar7 == list_4[(long)x_5 + -2];
      test((bool *)((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      x_5 = x_5 + 1;
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&index_3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_768);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_720);
  puVar1 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0,0);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0,1);
  *pvVar3 = 1;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  paVar2 = (allocator<int> *)
           ((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_838,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_838);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_838);
  local_d39 = false;
  if (sVar6 == 1) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_838);
    local_d39 = sVar6 == 0;
  }
  shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_d39;
  test((bool *)((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_838,0);
  shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = *piVar7 == 0;
  test((bool *)((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_838);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  puVar1 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_868,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_868,0);
  *pvVar3 = 0x18;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_868,1);
  *pvVar3 = 1;
  local_8b8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_868);
  _i_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_868);
  std::allocator<int>::allocator(&local_8c1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_8b0,local_8b8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_1,this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_8c1);
  std::allocator<int>::~allocator(&local_8c1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8b0);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8b0);
  local_d71 = false;
  if (sVar6 == 0x18) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8b0);
    local_d71 = sVar6 == 1;
  }
  local_8c2 = local_d71;
  test(&local_8c2);
  for (local_8c8 = 0; local_8c8 < 0x18; local_8c8 = local_8c8 + 1) {
    piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_8b0,local_8c8);
    shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar7 == this->data_[local_8c8];
    test((bool *)((long)&shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_868);
  puVar1 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8,0);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8,1);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8,2);
  *pvVar3 = 1;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8);
  paVar2 = (allocator<int> *)
           ((long)&shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_930,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_930);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_930);
  local_da9 = false;
  if (sVar6 == 1) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_930);
    local_da9 = sVar6 == 0;
  }
  shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_da9;
  test((bool *)((long)&shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_930,0);
  shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = *piVar7 == 0;
  test((bool *)((long)&shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_930);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8e8);
  puVar1 = &v_12.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_12.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960,0);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960,1);
  *pvVar3 = 0x18;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960,2);
  *pvVar3 = 1;
  local_9b0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960);
  _i_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960);
  std::allocator<int>::allocator(&local_9b9);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_9a8,local_9b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_2,this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_9b9);
  std::allocator<int>::~allocator(&local_9b9);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9a8);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9a8);
  local_de1 = false;
  if (sVar6 == 0x18) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9a8);
    local_de1 = sVar6 == 1;
  }
  local_9ba = local_de1;
  test(&local_9ba);
  for (local_9c0 = 0; local_9c0 < 0x18; local_9c0 = local_9c0 + 1) {
    piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_9a8,local_9c0);
    shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar7 == this->data_[local_9c0];
    test((bool *)((long)&shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_960);
  puVar1 = &v_13.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_13.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0,0);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0,1);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0,2);
  *pvVar3 = 2;
  local_a30._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0);
  _i_3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0);
  std::allocator<int>::allocator((allocator<int> *)((long)&y_4 + 3));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_a28,local_a30,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_3,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&y_4 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&y_4 + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a28);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a28);
  local_e19 = false;
  if (sVar6 == 6) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a28);
    local_e19 = sVar6 == 2;
  }
  y_4._2_1_ = local_e19;
  test((bool *)((long)&y_4 + 2));
  x_6 = 0;
  for (local_a44 = 0; local_a44 < 2; local_a44 = local_a44 + 1) {
    for (local_a48 = 0; local_a48 < 3; local_a48 = local_a48 + 1) {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_a28,(long)local_a48
                          ,local_a44);
      shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar7 == this->data_[x_6];
      test((bool *)((long)&shape_14.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
      x_6 = x_6 + 1;
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e0);
  puVar1 = &v_14.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,6,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_14.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,0);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,1);
  *pvVar3 = 2;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,2);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,3);
  *pvVar3 = 1;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,4);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68,5);
  *pvVar3 = 2;
  local_ab8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68);
  _i_4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68);
  std::allocator<int>::allocator((allocator<int> *)((long)&z + 3));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_ab0,local_ab8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_4,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&z + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ab0);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ab0);
  local_e51 = false;
  if (sVar6 == 0xc) {
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ab0);
    local_e51 = sVar6 == 3;
  }
  z._2_1_ = local_e51;
  test((bool *)((long)&z + 2));
  y_5 = 0;
  for (x_7 = 0; x_7 < 2; x_7 = x_7 + 1) {
    for (local_ad0 = 0; local_ad0 < 3; local_ad0 = local_ad0 + 1) {
      for (local_ad4 = 0; local_ad4 < 2; local_ad4 = local_ad4 + 1) {
        piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_ab0,
                            (long)local_ad4,local_ad0,x_7);
        local_ad5 = *piVar7 == this->data_[y_5];
        test(&local_ad5);
        y_5 = y_5 + 1;
      }
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ab0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a68);
  return;
}

Assistant:

void ViewTest::coordinateBindingTest() {
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,7);
            test(w.dimension()==0 && w.size()==1);
            test(w(0)==7);
        }
    }
    // 2D with... 
    {
        // bind(0,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,3);
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==3 && w(1)==9 && w(2)==15 && w(3)==21);
        }
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,3);
            
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==12 && w(1)==13 && w(2)==14 && w(3)==15);
        }
        // bind(1,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            int i = 12; 
            for(int x = 0; x < 6; ++x){
                test(w(x) == data_[i]);
                ++i;
            }
        }
        {
            int list[] = {2, 6, 10, 14, 18, 22};
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            for(int x = 0; x < 6; ++x){
                test(w(x) == list[x]);
            }
        }
    }
    // 3D with...
    {
        // bind(0,x)
        {
            int list[] = {2, 5, 8, 11, 14, 17, 20, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,2);
        
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        {
            int list[] = {16, 18, 20, 22, 17, 19, 21, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,2);
            
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        // bind(1,x)
        {
            int list[] = {6, 7, 8, 18, 19, 20};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {4, 12, 20, 5, 13, 21};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);

            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
    }
    // squeeze with...
    {
        // 2D to scalar 
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 1;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();
            
            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        }
        // 2D to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 24;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()== 24 && v.dimension()==1);
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        }
        // 3D to scalar 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        } 
        // 3D to 1D with squeeze
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 24;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==24 && v.dimension()==1
            );
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        } 
        // 3D to 2D
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==6 && v.dimension()==2
            );
            int i = 0; 
            for(int y = 0; y < 2; ++y){
                for(int x = 0; x < 3; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // 6D to 3D
        {
            std::vector<std::size_t> shape(6);
            shape[0] = 1;
            shape[1] = 2;
            shape[2] = 1;
            shape[3] = 1;
            shape[4] = 3;
            shape[5] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==12 && v.dimension()==3
            );
            int i = 0; 
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 3; ++y){
                    for(int x = 0; x < 2; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
}